

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
AddrManImpl::GetAddr_
          (AddrManImpl *this,size_t max_addresses,size_t max_pct,optional<Network> network,
          bool filtered)

{
  string_view source_file;
  bool bVar1;
  undefined1 uVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  AddrManImpl *this_00;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  vector<CAddress,_std::allocator<CAddress>_> *in_RDI;
  byte in_R9B;
  long in_FS_OFFSET;
  AddrInfo *ai;
  Level in_stack_00000080;
  unsigned_long *in_stack_00000090;
  int nRndPos;
  uint n;
  vector<CAddress,_std::allocator<CAddress>_> *addresses;
  const_iterator it;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> now;
  size_t nNodes;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  value_type *in_stack_fffffffffffffee0;
  vector<CAddress,_std::allocator<CAddress>_> *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  undefined5 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  Network in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  _Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> in_stack_ffffffffffffff10;
  char *flag;
  int in_stack_ffffffffffffff4c;
  NodeSeconds in_stack_ffffffffffffff58;
  uint local_90;
  ConstevalFormatString<1U> fmt;
  char *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  size_type local_20;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fmt.fmt = (char *)in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc,(AnnotatedMixin<std::mutex> *)0xee6ed2);
  local_20 = std::vector<long,_std::allocator<long>_>::size
                       ((vector<long,_std::allocator<long>_> *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (in_RCX != 0) {
    local_20 = (in_RCX * local_20) / 100;
  }
  if (in_RDX != 0) {
    puVar3 = std::min<unsigned_long>
                       ((unsigned_long *)in_stack_fffffffffffffee0,
                        (unsigned_long *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_20 = *puVar3;
  }
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_90 = 0;
  while ((sVar4 = std::vector<long,_std::allocator<long>_>::size
                            ((vector<long,_std::allocator<long>_> *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
         local_90 < sVar4 &&
         (sVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::size
                            ((vector<CAddress,_std::allocator<CAddress>_> *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
         sVar4 < local_20))) {
    this_00 = (AddrManImpl *)(in_RSI + 0x28);
    std::vector<long,_std::allocator<long>_>::size
              ((vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    RandomMixin<FastRandomContext>::randrange<unsigned_long>
              ((RandomMixin<FastRandomContext> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,
                                 CONCAT15(in_stack_fffffffffffffefd,in_stack_fffffffffffffef8))));
    SwapRandom(this_00,(uint)((ulong)in_stack_ffffffffffffff10._M_cur >> 0x20),
               (uint)in_stack_ffffffffffffff10._M_cur);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffee8,
               (size_type)in_stack_fffffffffffffee0);
    in_stack_ffffffffffffff10._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
         ::find((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                 *)in_stack_fffffffffffffee0,
                (key_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           *)in_stack_fffffffffffffee0);
    bVar1 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                       in_stack_fffffffffffffee8,
                       (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                       in_stack_fffffffffffffee0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("it != mapInfo.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x342,
                    "std::vector<CAddress> AddrManImpl::GetAddr_(size_t, size_t, std::optional<Network>, const bool) const"
                   );
    }
    std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::operator->
              ((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    bVar1 = std::operator==(local_10);
    in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 & 0xffffff;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff00 = CNetAddr::GetNetClass((CNetAddr *)in_stack_fffffffffffffee0);
      in_stack_fffffffffffffeff =
           std::operator!=((Network *)in_stack_fffffffffffffee8,
                           (optional<Network> *)in_stack_fffffffffffffee0);
      in_stack_ffffffffffffff04 =
           CONCAT13(in_stack_fffffffffffffeff,(int3)in_stack_ffffffffffffff04);
    }
    if (((char)(in_stack_ffffffffffffff04 >> 0x18) == '\0') &&
       ((in_stack_fffffffffffffefe =
              AddrInfo::IsTerrible
                        ((AddrInfo *)
                         CONCAT17(in_stack_fffffffffffffeff,
                                  CONCAT16(in_stack_fffffffffffffefe,
                                           CONCAT15(in_stack_fffffffffffffefd,
                                                    in_stack_fffffffffffffef8))),
                         in_stack_ffffffffffffff58), !(bool)in_stack_fffffffffffffefe ||
        ((in_R9B & 1) == 0)))) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    }
    local_90 = local_90 + 1;
  }
  uVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),Trace);
  if ((bool)uVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,CONCAT15(uVar2,in_stack_fffffffffffffef8)
                                )),in_stack_fffffffffffffef0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,CONCAT15(uVar2,in_stack_fffffffffffffef8)
                                )),in_stack_fffffffffffffef0);
    flag = "GetAddr returned %d random addresses\n";
    sVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::size
                      ((vector<CAddress,_std::allocator<CAddress>_> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    source_file._M_str = in_stack_ffffffffffffff98;
    source_file._M_len = sVar4;
    LogPrintFormatInternal<unsigned_long>
              (in_stack_ffffffffffffffa0,source_file,in_stack_ffffffffffffff4c,(LogFlags)flag,
               in_stack_00000080,fmt,in_stack_00000090);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> AddrManImpl::GetAddr_(size_t max_addresses, size_t max_pct, std::optional<Network> network, const bool filtered) const
{
    AssertLockHeld(cs);

    size_t nNodes = vRandom.size();
    if (max_pct != 0) {
        nNodes = max_pct * nNodes / 100;
    }
    if (max_addresses != 0) {
        nNodes = std::min(nNodes, max_addresses);
    }

    // gather a list of random nodes, skipping those of low quality
    const auto now{Now<NodeSeconds>()};
    std::vector<CAddress> addresses;
    for (unsigned int n = 0; n < vRandom.size(); n++) {
        if (addresses.size() >= nNodes)
            break;

        int nRndPos = insecure_rand.randrange(vRandom.size() - n) + n;
        SwapRandom(n, nRndPos);
        const auto it{mapInfo.find(vRandom[n])};
        assert(it != mapInfo.end());

        const AddrInfo& ai{it->second};

        // Filter by network (optional)
        if (network != std::nullopt && ai.GetNetClass() != network) continue;

        // Filter for quality
        if (ai.IsTerrible(now) && filtered) continue;

        addresses.push_back(ai);
    }
    LogDebug(BCLog::ADDRMAN, "GetAddr returned %d random addresses\n", addresses.size());
    return addresses;
}